

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall cmFindPackageCommand::FillPrefixesCMakeVariable(cmFindPackageCommand *this)

{
  undefined8 uVar1;
  cmAlphaNum local_1c8;
  cmAlphaNum local_198;
  string local_168;
  cmAlphaNum local_148;
  cmAlphaNum local_118;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_61;
  string local_60;
  size_t local_40;
  size_t debugOffset;
  string debugBuffer;
  cmSearchPath *paths;
  cmFindPackageCommand *this_local;
  
  debugBuffer.field_2._8_8_ =
       std::
       map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
       ::operator[](&(this->super_cmFindCommon).LabeledPaths,&cmFindCommon::PathLabel::CMake);
  std::__cxx11::string::string((string *)&debugOffset);
  uVar1 = debugBuffer.field_2._8_8_;
  local_40 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"CMAKE_PREFIX_PATH",&local_61);
  cmSearchPath::AddCMakePath((cmSearchPath *)uVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  if (((this->super_cmFindCommon).DebugMode & 1U) != 0) {
    std::__cxx11::string::operator=
              ((string *)&debugOffset,"CMAKE_PREFIX_PATH variable [CMAKE_FIND_USE_CMAKE_PATH].\n");
    local_40 = anon_unknown.dwarf_516e9f::collectPathsForDebug
                         ((string *)&debugOffset,(cmSearchPath *)debugBuffer.field_2._8_8_,0);
  }
  uVar1 = debugBuffer.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CMAKE_FRAMEWORK_PATH",&local_99);
  cmSearchPath::AddCMakePath((cmSearchPath *)uVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  uVar1 = debugBuffer.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"CMAKE_APPBUNDLE_PATH",&local_c1);
  cmSearchPath::AddCMakePath((cmSearchPath *)uVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  if (((this->super_cmFindCommon).DebugMode & 1U) != 0) {
    cmAlphaNum::cmAlphaNum(&local_118,(string *)&debugOffset);
    cmAlphaNum::cmAlphaNum
              (&local_148,
               "CMAKE_FRAMEWORK_PATH and CMAKE_APPBUNDLE_PATH variables [CMAKE_FIND_USE_CMAKE_PATH].\n"
              );
    cmStrCat<>(&local_e8,&local_118,&local_148);
    std::__cxx11::string::operator=((string *)&debugOffset,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    anon_unknown.dwarf_516e9f::collectPathsForDebug
              ((string *)&debugOffset,(cmSearchPath *)debugBuffer.field_2._8_8_,local_40);
    cmAlphaNum::cmAlphaNum(&local_198,&this->DebugBuffer);
    cmAlphaNum::cmAlphaNum(&local_1c8,(string *)&debugOffset);
    cmStrCat<>(&local_168,&local_198,&local_1c8);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
  }
  std::__cxx11::string::~string((string *)&debugOffset);
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesCMakeVariable()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMake];
  std::string debugBuffer;
  std::size_t debugOffset = 0;

  paths.AddCMakePath("CMAKE_PREFIX_PATH");
  if (this->DebugMode) {
    debugBuffer = "CMAKE_PREFIX_PATH variable [CMAKE_FIND_USE_CMAKE_PATH].\n";
    debugOffset = collectPathsForDebug(debugBuffer, paths);
  }

  paths.AddCMakePath("CMAKE_FRAMEWORK_PATH");
  paths.AddCMakePath("CMAKE_APPBUNDLE_PATH");
  if (this->DebugMode) {
    debugBuffer =
      cmStrCat(debugBuffer,
               "CMAKE_FRAMEWORK_PATH and CMAKE_APPBUNDLE_PATH variables "
               "[CMAKE_FIND_USE_CMAKE_PATH].\n");
    collectPathsForDebug(debugBuffer, paths, debugOffset);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}